

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImGui::ShadeVertsTransformPos
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *pivot_in,
               float cos_a,float sin_a,ImVec2 *pivot_out)

{
  ImDrawVert *pIVar1;
  ImDrawVert *vertex;
  ImDrawVert *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  
  pIVar1 = (draw_list->VtxBuffer).Data;
  for (pIVar2 = pIVar1 + vert_start_idx; pIVar2 < pIVar1 + vert_end_idx; pIVar2 = pIVar2 + 1) {
    fVar3 = (pIVar2->pos).x - pivot_in->x;
    fVar4 = (pIVar2->pos).y - pivot_in->y;
    IVar5.x = (*pivot_out).x + fVar3 * cos_a + -fVar4 * sin_a;
    IVar5.y = (*pivot_out).y + fVar3 * sin_a + fVar4 * cos_a;
    pIVar2->pos = IVar5;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsTransformPos(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& pivot_in, float cos_a, float sin_a, const ImVec2& pivot_out)
{
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
        vertex->pos = ImRotate(vertex->pos- pivot_in, cos_a, sin_a) + pivot_out;
}